

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-signal.c
# Opt level: O3

int run_test_we_get_signals_mixed(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *loop;
  uv_handle_t *handle;
  int64_t eval_b;
  int64_t eval_a;
  timer_ctx tc;
  signal_ctx sc [4];
  undefined1 local_2e8 [144];
  undefined1 local_258 [136];
  undefined1 local_1d0 [136];
  undefined1 local_148 [136];
  signal_ctx local_c0;
  
  loop = uv_default_loop();
  start_timer(loop,0x11,(timer_ctx *)(local_2e8 + 8));
  start_watcher(loop,0x11,(signal_ctx *)local_258,1);
  start_watcher(loop,0x11,(signal_ctx *)local_1d0,1);
  local_258._0_4_ = CLOSE;
  local_1d0._0_4_ = CLOSE;
  iVar1 = uv_run(loop,UV_RUN_DEFAULT);
  local_2e8._0_8_ = SEXT48(iVar1);
  if ((void *)local_2e8._0_8_ == (void *)0x0) {
    local_2e8._0_8_ = ZEXT48((uint)local_2e8._8_4_);
    if ((void *)local_2e8._0_8_ != (void *)0xa) goto LAB_001ba84f;
    local_2e8._0_8_ = (void *)0x1;
    if (local_258._4_4_ != 1) goto LAB_001ba85e;
    local_2e8._0_8_ = (void *)0x1;
    if (local_1d0._4_4_ != 1) goto LAB_001ba86d;
    start_timer(loop,0x11,(timer_ctx *)(local_2e8 + 8));
    start_watcher(loop,0x11,(signal_ctx *)local_258,1);
    start_watcher(loop,0x11,(signal_ctx *)local_1d0,1);
    local_258._0_4_ = CLOSE;
    local_1d0._0_4_ = CLOSE;
    start_watcher(loop,0x11,(signal_ctx *)local_148,0);
    uv_close((uv_handle_t *)(local_148 + 8),(uv_close_cb)0x0);
    iVar1 = uv_run(loop,UV_RUN_DEFAULT);
    local_2e8._0_8_ = SEXT48(iVar1);
    if ((void *)local_2e8._0_8_ != (void *)0x0) goto LAB_001ba87c;
    local_2e8._0_8_ = ZEXT48((uint)local_2e8._8_4_);
    if ((void *)local_2e8._0_8_ != (void *)0xa) goto LAB_001ba88b;
    local_2e8._0_8_ = (void *)0x1;
    if (local_258._4_4_ != 1) goto LAB_001ba89a;
    local_2e8._0_8_ = (void *)0x1;
    if (local_1d0._4_4_ != 1) goto LAB_001ba8a9;
    local_2e8._0_8_ = ZEXT48((uint)local_148._4_4_);
    if ((void *)local_2e8._0_8_ != (void *)0x0) goto LAB_001ba8b8;
    start_timer(loop,0x11,(timer_ctx *)(local_2e8 + 8));
    start_watcher(loop,0x11,(signal_ctx *)local_258,0);
    start_watcher(loop,0x11,(signal_ctx *)local_1d0,0);
    local_258._0_4_ = CLOSE;
    local_1d0._0_4_ = CLOSE;
    start_watcher(loop,0x11,(signal_ctx *)local_148,1);
    uv_close((uv_handle_t *)(local_148 + 8),(uv_close_cb)0x0);
    iVar1 = uv_run(loop,UV_RUN_DEFAULT);
    local_2e8._0_8_ = SEXT48(iVar1);
    if ((void *)local_2e8._0_8_ != (void *)0x0) goto LAB_001ba8c7;
    local_2e8._0_8_ = ZEXT48((uint)local_2e8._8_4_);
    if ((void *)local_2e8._0_8_ != (void *)0xa) goto LAB_001ba8d6;
    local_2e8._0_8_ = ZEXT48((uint)local_258._4_4_);
    if ((void *)local_2e8._0_8_ != (void *)0xa) goto LAB_001ba8e5;
    local_2e8._0_8_ = ZEXT48((uint)local_1d0._4_4_);
    if ((void *)local_2e8._0_8_ != (void *)0xa) goto LAB_001ba8f4;
    local_2e8._0_8_ = ZEXT48((uint)local_148._4_4_);
    if ((void *)local_2e8._0_8_ != (void *)0x0) goto LAB_001ba903;
    start_timer(loop,0x11,(timer_ctx *)(local_2e8 + 8));
    start_watcher(loop,0x11,(signal_ctx *)local_258,0);
    start_watcher(loop,0x11,(signal_ctx *)local_1d0,0);
    start_watcher(loop,0x11,(signal_ctx *)local_148,1);
    start_watcher(loop,0x11,&local_c0,1);
    local_148._0_4_ = CLOSE;
    local_c0.stop_or_close = CLOSE;
    uv_close((uv_handle_t *)(local_258 + 8),(uv_close_cb)0x0);
    uv_close((uv_handle_t *)(local_1d0 + 8),(uv_close_cb)0x0);
    iVar1 = uv_run(loop,UV_RUN_DEFAULT);
    local_2e8._0_8_ = SEXT48(iVar1);
    if ((void *)local_2e8._0_8_ != (void *)0x0) goto LAB_001ba912;
    local_2e8._0_8_ = ZEXT48((uint)local_2e8._8_4_);
    if ((void *)local_2e8._0_8_ != (void *)0xa) goto LAB_001ba921;
    local_2e8._0_8_ = ZEXT48((uint)local_258._4_4_);
    if ((void *)local_2e8._0_8_ != (void *)0x0) goto LAB_001ba930;
    local_2e8._0_8_ = ZEXT48((uint)local_1d0._4_4_);
    if ((void *)local_2e8._0_8_ != (void *)0x0) goto LAB_001ba93f;
    local_2e8._0_8_ = (void *)0x1;
    if (local_148._4_4_ != 1) goto LAB_001ba94e;
    local_2e8._0_8_ = (void *)0x1;
    start_timer(loop,0x11,(timer_ctx *)(local_2e8 + 8));
    start_watcher(loop,0x11,(signal_ctx *)local_258,0);
    start_watcher(loop,0x11,(signal_ctx *)local_1d0,1);
    start_watcher(loop,0x11,(signal_ctx *)local_148,0);
    start_watcher(loop,0x11,&local_c0,0);
    local_c0.stop_or_close = CLOSE;
    uv_close((uv_handle_t *)(local_258 + 8),(uv_close_cb)0x0);
    uv_close((uv_handle_t *)(local_148 + 8),(uv_close_cb)0x0);
    iVar1 = uv_run(loop,UV_RUN_DEFAULT);
    local_2e8._0_8_ = SEXT48(iVar1);
    if ((void *)local_2e8._0_8_ != (void *)0x0) goto LAB_001ba96c;
    local_2e8._0_8_ = ZEXT48((uint)local_2e8._8_4_);
    if ((void *)local_2e8._0_8_ != (void *)0xa) goto LAB_001ba97b;
    local_2e8._0_8_ = ZEXT48((uint)local_258._4_4_);
    if ((void *)local_2e8._0_8_ != (void *)0x0) goto LAB_001ba98a;
    local_2e8._0_8_ = (void *)0x1;
    if (local_1d0._4_4_ != 1) goto LAB_001ba999;
    local_2e8._0_8_ = ZEXT48((uint)local_148._4_4_);
    if ((void *)local_2e8._0_8_ != (void *)0x0) goto LAB_001ba9a8;
    local_2e8._0_8_ = ZEXT48(local_c0.ncalls);
    if ((void *)local_2e8._0_8_ == (void *)0xa) {
      uv_walk(loop,close_walk_cb,(void *)0x0);
      uv_run(loop,UV_RUN_DEFAULT);
      local_2e8._0_8_ = (void *)0x0;
      iVar1 = uv_loop_close(loop);
      if ((void *)local_2e8._0_8_ == (void *)(long)iVar1) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001ba9c6;
    }
  }
  else {
    run_test_we_get_signals_mixed_cold_1();
LAB_001ba84f:
    run_test_we_get_signals_mixed_cold_2();
LAB_001ba85e:
    run_test_we_get_signals_mixed_cold_3();
LAB_001ba86d:
    run_test_we_get_signals_mixed_cold_4();
LAB_001ba87c:
    run_test_we_get_signals_mixed_cold_5();
LAB_001ba88b:
    run_test_we_get_signals_mixed_cold_6();
LAB_001ba89a:
    run_test_we_get_signals_mixed_cold_7();
LAB_001ba8a9:
    run_test_we_get_signals_mixed_cold_8();
LAB_001ba8b8:
    run_test_we_get_signals_mixed_cold_9();
LAB_001ba8c7:
    run_test_we_get_signals_mixed_cold_10();
LAB_001ba8d6:
    run_test_we_get_signals_mixed_cold_11();
LAB_001ba8e5:
    run_test_we_get_signals_mixed_cold_12();
LAB_001ba8f4:
    run_test_we_get_signals_mixed_cold_13();
LAB_001ba903:
    run_test_we_get_signals_mixed_cold_14();
LAB_001ba912:
    run_test_we_get_signals_mixed_cold_15();
LAB_001ba921:
    run_test_we_get_signals_mixed_cold_16();
LAB_001ba930:
    run_test_we_get_signals_mixed_cold_17();
LAB_001ba93f:
    run_test_we_get_signals_mixed_cold_18();
LAB_001ba94e:
    run_test_we_get_signals_mixed_cold_19();
    run_test_we_get_signals_mixed_cold_20();
LAB_001ba96c:
    run_test_we_get_signals_mixed_cold_21();
LAB_001ba97b:
    run_test_we_get_signals_mixed_cold_22();
LAB_001ba98a:
    run_test_we_get_signals_mixed_cold_23();
LAB_001ba999:
    run_test_we_get_signals_mixed_cold_24();
LAB_001ba9a8:
    run_test_we_get_signals_mixed_cold_25();
  }
  run_test_we_get_signals_mixed_cold_26();
LAB_001ba9c6:
  handle = (uv_handle_t *)local_2e8;
  run_test_we_get_signals_mixed_cold_27();
  iVar1 = uv_is_closing(handle);
  if (iVar1 == 0) {
    uv_close(handle,(uv_close_cb)0x0);
    return extraout_EAX;
  }
  return iVar1;
}

Assistant:

TEST_IMPL(we_get_signals_mixed) {
  struct signal_ctx sc[4];
  struct timer_ctx tc;
  uv_loop_t* loop;

  loop = uv_default_loop();

  /* 2 one-shot */
  start_timer(loop, SIGCHLD, &tc);
  start_watcher(loop, SIGCHLD, sc + 0, 1);
  start_watcher(loop, SIGCHLD, sc + 1, 1);
  sc[0].stop_or_close = CLOSE;
  sc[1].stop_or_close = CLOSE;
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(tc.ncalls, NSIGNALS);
  ASSERT_EQ(1, sc[0].ncalls);
  ASSERT_EQ(1, sc[1].ncalls);

  /* 2 one-shot, 1 normal then remove normal */
  start_timer(loop, SIGCHLD, &tc);
  start_watcher(loop, SIGCHLD, sc + 0, 1);
  start_watcher(loop, SIGCHLD, sc + 1, 1);
  sc[0].stop_or_close = CLOSE;
  sc[1].stop_or_close = CLOSE;
  start_watcher(loop, SIGCHLD, sc + 2, 0);
  uv_close((uv_handle_t*)&(sc[2]).handle, NULL);
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(tc.ncalls, NSIGNALS);
  ASSERT_EQ(1, sc[0].ncalls);
  ASSERT_EQ(1, sc[1].ncalls);
  ASSERT_OK(sc[2].ncalls);

  /* 2 normal, 1 one-shot then remove one-shot */
  start_timer(loop, SIGCHLD, &tc);
  start_watcher(loop, SIGCHLD, sc + 0, 0);
  start_watcher(loop, SIGCHLD, sc + 1, 0);
  sc[0].stop_or_close = CLOSE;
  sc[1].stop_or_close = CLOSE;
  start_watcher(loop, SIGCHLD, sc + 2, 1);
  uv_close((uv_handle_t*)&(sc[2]).handle, NULL);
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(tc.ncalls, NSIGNALS);
  ASSERT_EQ(sc[0].ncalls, NSIGNALS);
  ASSERT_EQ(sc[1].ncalls, NSIGNALS);
  ASSERT_OK(sc[2].ncalls);

  /* 2 normal, 2 one-shot then remove 2 normal */
  start_timer(loop, SIGCHLD, &tc);
  start_watcher(loop, SIGCHLD, sc + 0, 0);
  start_watcher(loop, SIGCHLD, sc + 1, 0);
  start_watcher(loop, SIGCHLD, sc + 2, 1);
  start_watcher(loop, SIGCHLD, sc + 3, 1);
  sc[2].stop_or_close = CLOSE;
  sc[3].stop_or_close = CLOSE;
  uv_close((uv_handle_t*)&(sc[0]).handle, NULL);
  uv_close((uv_handle_t*)&(sc[1]).handle, NULL);
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(tc.ncalls, NSIGNALS);
  ASSERT_OK(sc[0].ncalls);
  ASSERT_OK(sc[1].ncalls);
  ASSERT_EQ(1, sc[2].ncalls);
  ASSERT_EQ(1, sc[2].ncalls);

  /* 1 normal, 1 one-shot, 2 normal then remove 1st normal, 2nd normal */
  start_timer(loop, SIGCHLD, &tc);
  start_watcher(loop, SIGCHLD, sc + 0, 0);
  start_watcher(loop, SIGCHLD, sc + 1, 1);
  start_watcher(loop, SIGCHLD, sc + 2, 0);
  start_watcher(loop, SIGCHLD, sc + 3, 0);
  sc[3].stop_or_close = CLOSE;
  uv_close((uv_handle_t*)&(sc[0]).handle, NULL);
  uv_close((uv_handle_t*)&(sc[2]).handle, NULL);
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(tc.ncalls, NSIGNALS);
  ASSERT_OK(sc[0].ncalls);
  ASSERT_EQ(1, sc[1].ncalls);
  ASSERT_OK(sc[2].ncalls);
  ASSERT_EQ(sc[3].ncalls, NSIGNALS);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}